

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  string *__lhs;
  string *psVar2;
  ostream *poVar3;
  ostringstream ss;
  allocator<char> local_1c0 [32];
  ostream local_1a0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_GENERATOR",local_1c0);
  __lhs = cmMakefile::GetSafeDefinition(mf,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_MAKE_PROGRAM",local_1c0);
  psVar2 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  bVar1 = std::operator==(__lhs,"NMake Makefiles");
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"Ninja");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"MinGW Makefiles");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"Unix Makefiles");
        if (!bVar1) goto LAB_0043abe4;
      }
      poVar3 = std::operator<<(&local_1a0,(string *)psVar2);
      std::operator<<(poVar3," -f$(ProjectPath)/Makefile");
      if (this->CpuCount != 0) {
        poVar3 = std::operator<<(&local_1a0," -j ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      }
      goto LAB_0043abe4;
    }
  }
  std::operator<<(&local_1a0,(string *)psVar2);
LAB_0043abe4:
  if (targetName->_M_string_length != 0) {
    poVar3 = std::operator<<(&local_1a0," ");
    std::operator<<(poVar3,(string *)targetName);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetBuildCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  const std::string& generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  std::ostringstream ss;
  if (generator == "NMake Makefiles" || generator == "Ninja") {
    ss << make;
  } else if (generator == "MinGW Makefiles" || generator == "Unix Makefiles") {
    ss << make << " -f$(ProjectPath)/Makefile";
    if (this->CpuCount > 0) {
      ss << " -j " << this->CpuCount;
    }
  }
  if (!targetName.empty()) {
    ss << " " << targetName;
  }
  buildCommand = ss.str();
  return buildCommand;
}